

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shell.cpp
# Opt level: O1

int dump_callback(void *pArg,int nArg,char **azArg,char **azNotUsed)

{
  undefined4 uVar1;
  undefined8 uVar2;
  char cVar3;
  int iVar4;
  char **azCol;
  char *pcVar5;
  FILE *__s;
  char *pcVar6;
  size_t __size;
  char *pcVar7;
  char **ppcVar8;
  string sSelect;
  string sTable;
  string local_70;
  string local_50;
  
  if (azArg == (char **)0x0 || nArg != 3) {
    return 0;
  }
  pcVar5 = *azArg;
  pcVar6 = azArg[1];
  pcVar7 = azArg[2];
  iVar4 = strcmp(pcVar5,"sqlite_sequence");
  if (iVar4 == 0) {
    __s = *(FILE **)((long)pArg + 0x20);
    pcVar7 = "DELETE FROM sqlite_sequence;\n";
    __size = 0x1d;
LAB_00214e26:
    fwrite(pcVar7,__size,1,__s);
  }
  else {
    iVar4 = duckdb_shell_sqlite3_strglob("sqlite_stat?",pcVar5);
    if (iVar4 == 0) {
      __s = *(FILE **)((long)pArg + 0x20);
      pcVar7 = "ANALYZE sqlite_schema;\n";
      __size = 0x17;
      goto LAB_00214e26;
    }
    iVar4 = strncmp(pcVar5,"sqlite_",7);
    if (iVar4 == 0) {
      return 0;
    }
    iVar4 = strncmp(pcVar7,"CREATE VIRTUAL TABLE",0x14);
    if (iVar4 == 0) {
      pcVar5 = duckdb_shell_sqlite3_mprintf
                         ("INSERT INTO sqlite_schema(type,name,tbl_name,rootpage,sql)VALUES(\'table\',\'%q\',\'%q\',0,\'%q\');"
                          ,pcVar5,pcVar5,pcVar7);
      fprintf(*(FILE **)((long)pArg + 0x20),"%s\n",pcVar5);
      duckdb_shell_sqlite3_free(pcVar5);
      return 0;
    }
    duckdb_shell::ShellState::PrintSchemaLine((ShellState *)pArg,pcVar7,";\n");
  }
  iVar4 = strcmp(pcVar6,"table");
  if (iVar4 != 0) {
    return 0;
  }
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  local_70._M_string_length = 0;
  local_70.field_2._M_local_buf[0] = '\0';
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  local_50._M_string_length = 0;
  local_50.field_2._M_local_buf[0] = '\0';
  azCol = duckdb_shell::ShellState::TableColumnList((ShellState *)pArg,pcVar5);
  if (azCol != (char **)0x0) {
    cVar3 = quoteChar(pcVar5);
    appendText(&local_50,pcVar5,cVar3);
    if (*azCol != (char *)0x0) {
      std::__cxx11::string::append((char *)&local_50);
      std::__cxx11::string::append((char *)&local_50);
      if (azCol[1] != (char *)0x0) {
        ppcVar8 = azCol + 2;
        do {
          std::__cxx11::string::append((char *)&local_50);
          pcVar6 = ppcVar8[-1];
          cVar3 = quoteChar(pcVar6);
          appendText(&local_50,pcVar6,cVar3);
          pcVar6 = *ppcVar8;
          ppcVar8 = ppcVar8 + 1;
        } while (pcVar6 != (char *)0x0);
      }
      std::__cxx11::string::append((char *)&local_50);
    }
    std::__cxx11::string::append((char *)&local_70);
    if (*azCol != (char *)0x0) {
      std::__cxx11::string::append((char *)&local_70);
      std::__cxx11::string::append((char *)&local_70);
    }
    pcVar6 = azCol[1];
    if (pcVar6 != (char *)0x0) {
      ppcVar8 = azCol + 2;
      do {
        cVar3 = quoteChar(pcVar6);
        appendText(&local_70,pcVar6,cVar3);
        if (*ppcVar8 != (char *)0x0) {
          std::__cxx11::string::append((char *)&local_70);
        }
        pcVar6 = *ppcVar8;
        ppcVar8 = ppcVar8 + 1;
      } while (pcVar6 != (char *)0x0);
    }
    freeColumnList(azCol);
    std::__cxx11::string::append((char *)&local_70);
    cVar3 = quoteChar(pcVar5);
    appendText(&local_70,pcVar5,cVar3);
    uVar2 = *(undefined8 *)((long)pArg + 0x50);
    uVar1 = *(undefined4 *)((long)pArg + 0x2c);
    *(pointer *)((long)pArg + 0x50) = local_50._M_dataplus._M_p;
    *(undefined4 *)((long)pArg + 0x34) = 5;
    *(undefined4 *)((long)pArg + 0x2c) = 5;
    iVar4 = duckdb_shell::ShellState::ExecuteSQL
                      ((ShellState *)pArg,local_70._M_dataplus._M_p,(char **)0x0);
    if ((char)iVar4 == '\v') {
      fwrite("/****** CORRUPTION ERROR *******/\n",0x22,1,*(FILE **)((long)pArg + 0x20));
      toggleSelectOrder(*pArg);
      duckdb_shell::ShellState::ExecuteSQL
                ((ShellState *)pArg,local_70._M_dataplus._M_p,(char **)0x0);
      toggleSelectOrder(*pArg);
    }
    *(undefined8 *)((long)pArg + 0x50) = uVar2;
    *(undefined4 *)((long)pArg + 0x2c) = uVar1;
    if (iVar4 == 0) goto LAB_0021504e;
  }
  *(int *)((long)pArg + 0x28) = *(int *)((long)pArg + 0x28) + 1;
LAB_0021504e:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  return 0;
}

Assistant:

static int dump_callback(void *pArg, int nArg, char **azArg, char **azNotUsed) {
	int rc;
	const char *zTable;
	const char *zType;
	const char *zSql;
	ShellState *p = (ShellState *)pArg;

	UNUSED_PARAMETER(azNotUsed);
	if (nArg != 3 || azArg == 0)
		return 0;
	zTable = azArg[0];
	zType = azArg[1];
	zSql = azArg[2];

	if (strcmp(zTable, "sqlite_sequence") == 0) {
		raw_printf(p->out, "DELETE FROM sqlite_sequence;\n");
	} else if (sqlite3_strglob("sqlite_stat?", zTable) == 0) {
		raw_printf(p->out, "ANALYZE sqlite_schema;\n");
	} else if (strncmp(zTable, "sqlite_", 7) == 0) {
		return 0;
	} else if (strncmp(zSql, "CREATE VIRTUAL TABLE", 20) == 0) {
		char *zIns;
		zIns = sqlite3_mprintf("INSERT INTO sqlite_schema(type,name,tbl_name,rootpage,sql)"
		                       "VALUES('table','%q','%q',0,'%q');",
		                       zTable, zTable, zSql);
		utf8_printf(p->out, "%s\n", zIns);
		sqlite3_free(zIns);
		return 0;
	} else {
		p->PrintSchemaLine(zSql, ";\n");
	}

	if (strcmp(zType, "table") == 0) {
		string sSelect;
		string sTable;
		char **azCol;
		int i;
		char *savedDestTable;
		RenderMode savedMode;

		azCol = p->TableColumnList(zTable);
		if (azCol == 0) {
			p->nErr++;
			return 0;
		}

		/* Always quote the table name, even if it appears to be pure ascii,
		** in case it is a keyword. Ex:  INSERT INTO "table" ... */
		appendText(sTable, zTable, quoteChar(zTable));
		/* If preserving the rowid, add a column list after the table name.
		** In other words:  "INSERT INTO tab(rowid,a,b,c,...) VALUES(...)"
		** instead of the usual "INSERT INTO tab VALUES(...)".
		*/
		if (azCol[0]) {
			appendText(sTable, "(", 0);
			appendText(sTable, azCol[0], 0);
			for (i = 1; azCol[i]; i++) {
				appendText(sTable, ",", 0);
				appendText(sTable, azCol[i], quoteChar(azCol[i]));
			}
			appendText(sTable, ")", 0);
		}

		/* Build an appropriate SELECT statement */
		appendText(sSelect, "SELECT ", 0);
		if (azCol[0]) {
			appendText(sSelect, azCol[0], 0);
			appendText(sSelect, ",", 0);
		}
		for (i = 1; azCol[i]; i++) {
			appendText(sSelect, azCol[i], quoteChar(azCol[i]));
			if (azCol[i + 1]) {
				appendText(sSelect, ",", 0);
			}
		}
		freeColumnList(azCol);
		appendText(sSelect, " FROM ", 0);
		appendText(sSelect, zTable, quoteChar(zTable));

		savedDestTable = p->zDestTable;
		savedMode = p->mode;
		p->zDestTable = (char *)sTable.c_str();
		p->mode = p->cMode = RenderMode::INSERT;
		rc = p->ExecuteSQL(sSelect.c_str(), 0);
		if ((rc & 0xff) == SQLITE_CORRUPT) {
			raw_printf(p->out, "/****** CORRUPTION ERROR *******/\n");
			toggleSelectOrder(p->db);
			p->ExecuteSQL(sSelect.c_str(), 0);
			toggleSelectOrder(p->db);
		}
		p->zDestTable = savedDestTable;
		p->mode = savedMode;
		if (rc)
			p->nErr++;
	}
	return 0;
}